

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O3

int Mig_ManSuppSizeTest(Mig_Man_t *p)

{
  Mig_Obj_t *pMVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  Mig_Obj_t *pObj;
  timespec ts;
  timespec local_30;
  
  iVar2 = clock_gettime(3,&local_30);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  p->iPage = 0;
  iVar2 = (p->vPages).nSize;
  uVar7 = 0;
  if (0 < iVar2) {
    uVar5 = 0;
    do {
      iVar3 = (int)uVar5;
      if (iVar3 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Mig_Obj_t *)(p->vPages).pArray[uVar5];
      p->pPage = pObj;
      if (pObj == (Mig_Obj_t *)0x0) break;
      if ((uint)pObj->pFans[3] < 0xfffffffe) {
        do {
          if ((uint)pObj->pFans[1] < 0xfffffffe) {
            iVar2 = Mig_ManSuppSizeOne(pObj);
            uVar7 = uVar7 + (iVar2 < 0x11);
          }
          pMVar1 = pObj + 1;
          pObj = pObj + 1;
        } while ((uint)pMVar1->pFans[3] < 0xfffffffe);
        iVar2 = (p->vPages).nSize;
        iVar3 = p->iPage;
      }
      uVar4 = iVar3 + 1;
      uVar5 = (ulong)uVar4;
      p->iPage = uVar4;
    } while ((int)uVar4 < iVar2);
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar7,
         (ulong)(uint)(~((p->vCos).nSize + (p->vCis).nSize) + p->nObjs));
  iVar3 = 3;
  iVar2 = clock_gettime(3,&local_30);
  if (iVar2 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%s =","Time");
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar8 + lVar6) / 1000000.0);
  return uVar7;
}

Assistant:

int Mig_ManSuppSizeTest( Mig_Man_t * p )
{
    Mig_Obj_t * pObj;
    int Counter = 0;
    abctime clk = Abc_Clock();
    Mig_ManForEachObj( p, pObj )
        if ( Mig_ObjIsNode(pObj) )
            Counter += (Mig_ManSuppSizeOne(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Mig_ManNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}